

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execDiv<(moira::Instr)57,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong uVar2;
  bool error;
  bool local_19;
  
  uVar1 = computeEA<(moira::Mode)9,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,128ul>(this,uVar1,&local_19);
  if (local_19 == false) {
    if (uVar1 == 0) {
      (this->reg).sr.n = false;
      (this->reg).sr.z = true;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
      (*this->_vptr_Moira[0x19])(this,8);
      execTrapException(this,5);
    }
    else {
      uVar2 = (ulong)(opcode >> 9 & 7);
      uVar1 = div<(moira::Instr)57>(this,*(u32 *)((long)this->exec + uVar2 * 4 + -0x58),uVar1);
      *(u32 *)((long)this->exec + uVar2 * 4 + -0x58) = uVar1;
      uVar1 = (this->reg).pc;
      (this->reg).pc0 = uVar1;
      (this->queue).ird = (this->queue).irc;
      uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
      (this->queue).irc = (u16)uVar1;
    }
  }
  return;
}

Assistant:

void
Moira::execDiv(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execDivMusashi<I, M, S>(opcode);
        return;
    }

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, divisor, result;
    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, divisor)) return;
    u32 dividend = readD(dst);
    
    // Check for division by zero
    if (divisor == 0) {

        if (I == DIVU) {
            reg.sr.n = NBIT<Long>(dividend);
            reg.sr.z = (dividend & 0xFFFF0000) == 0;
            reg.sr.v = 0;
            reg.sr.c = 0;
        } else {
            reg.sr.n = 0;
            reg.sr.z = 1;
            reg.sr.v = 0;
            reg.sr.c = 0;
        }

        sync(8);
        execTrapException(5);
        return;
    }

    result = div<I>(dividend, divisor);

    writeD(dst, result);
    prefetch<POLLIPL>();
}